

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validatevulnerability.cpp
# Opt level: O1

int __thiscall ValidateVulnerability::ScanLine(ValidateVulnerability *this)

{
  int iVar1;
  
  iVar1 = __isoc99_sscanf(&this->super_Validate,"%lld,%d,%d,%f",&this->initialVulID_,
                          &(this->v_).intensity_bin_id,&(this->v_).damage_bin_id,
                          &(this->v_).probability);
  return iVar1;
}

Assistant:

int ValidateVulnerability::ScanLine() {
/* The probability field is defined according to the data type assigned to
 * OASIS_FLOAT in include/oasis.h */

#ifdef OASIS_FLOAT_TYPE_DOUBLE
  return sscanf(line_, "%lld,%d,%d,%lf", &initialVulID_, &v_.intensity_bin_id,
					 &v_.damage_bin_id, &v_.probability);
#else
  return sscanf(line_, "%lld,%d,%d,%f", &initialVulID_, &v_.intensity_bin_id,
					&v_.damage_bin_id, &v_.probability);
#endif

}